

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::fpToString<double>(double value,int precision)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int in_ESI;
  string *in_RDI;
  double in_XMM0_Qa;
  size_t i;
  ReusableStringStream rss;
  string *d;
  ReusableStringStream *in_stack_ffffffffffffff48;
  ReusableStringStream *in_stack_ffffffffffffff50;
  _Setprecision *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string *this;
  ReusableStringStream *in_stack_ffffffffffffff90;
  allocator local_15;
  int local_14;
  
  this = in_RDI;
  local_14 = in_ESI;
  uVar1 = isnan(in_XMM0_Qa);
  if ((uVar1 & 1) == 0) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)this);
    clara::std::setprecision(local_14);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff50,
               (_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff48);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff50,(double *)in_stack_ffffffffffffff48);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff48);
    lVar2 = std::__cxx11::string::find_last_not_of((char)this,0x30);
    if ((lVar2 != -1) && (lVar3 = std::__cxx11::string::size(), lVar2 != lVar3 + -1)) {
      std::__cxx11::string::operator[]((ulong)this);
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff90,(ulong)this);
      std::__cxx11::string::operator=((string *)this,(string *)&stack0xffffffffffffff90);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    }
    ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffff90);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"nan",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  return in_RDI;
}

Assistant:

std::string fpToString( T value, int precision ) {
    if (Catch::isnan(value)) {
        return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}